

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestCases.cpp
# Opt level: O1

void Test7(void)

{
  CMReturn In;
  long lVar1;
  long *plVar2;
  initializer_list<unsigned_long> __l;
  initializer_list<unsigned_long> __l_00;
  string in;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  map;
  CMReturn res;
  ConfusableMatcher matcher;
  allocator_type local_21fa;
  allocator_type local_21f9;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_21f8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_21e0;
  long *local_21c8;
  long local_21c0;
  long local_21b8 [2];
  string local_21a8;
  string local_2188;
  CM_RETURN_STATUS *local_2168;
  uint64_t uStack_2160;
  CM_RETURN_STATUS local_2158;
  undefined4 uStack_2154;
  undefined1 local_2148;
  undefined7 uStack_2147;
  undefined1 uStack_2140;
  undefined7 uStack_213f;
  undefined1 uStack_2138;
  undefined7 uStack_2137;
  undefined8 uStack_2130;
  undefined8 local_2128;
  undefined8 uStack_2120;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_2118;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_2100;
  CMReturn local_20e8;
  undefined1 *local_20c8 [2];
  undefined1 local_20b8 [16];
  long *local_20a8 [2];
  long local_2098 [6];
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_2068;
  ConfusableMatcher local_2030;
  
  GetDefaultMap_abi_cxx11_();
  local_21c8 = local_21b8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_21c8,anon_var_dwarf_164dd,anon_var_dwarf_164dd + 0x79);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::vector(&local_2118,&local_2100);
  local_20e8.Start = (uint64_t)&local_20e8.Status;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_20e8,"_","");
  local_20c8[0] = local_20b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_20c8,"%","");
  plVar2 = local_2098;
  local_20a8[0] = plVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_20a8,"$","");
  std::
  _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
  ::_Hashtable<std::__cxx11::string_const*>
            ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
              *)&local_2068,&local_20e8,local_2098 + 2,0,local_2098 + 4,local_2098 + 2,&local_21fa);
  ConfusableMatcher::ConfusableMatcher
            (&local_2030,&local_2118,
             (unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_2068,true);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&local_2068);
  lVar1 = -0x60;
  do {
    if (plVar2 != (long *)plVar2[-2]) {
      operator_delete((long *)plVar2[-2],*plVar2 + 1);
    }
    plVar2 = plVar2 + -4;
    lVar1 = lVar1 + 0x20;
  } while (lVar1 != 0);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&local_2118);
  local_2188._M_dataplus._M_p = (pointer)&local_2188.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_2188,local_21c8,local_21c0 + (long)local_21c8);
  local_21a8._M_dataplus._M_p = (pointer)&local_21a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_21a8,"NIGGER","");
  local_2148 = 1;
  uStack_2147 = 0;
  uStack_2140 = 0;
  uStack_213f = 0;
  uStack_2138 = 0;
  uStack_2137 = 0;
  uStack_2130 = 1000000;
  local_2128 = 0;
  uStack_2120 = 0;
  ConfusableMatcher::IndexOf
            (&local_20e8,&local_2030,&local_2188,&local_21a8,
             (CMOptions)ZEXT3248(CONCAT824(1000000,CONCAT816(0,ZEXT816(1)))));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_21a8._M_dataplus._M_p != &local_21a8.field_2) {
    operator_delete(local_21a8._M_dataplus._M_p,local_21a8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2188._M_dataplus._M_p != &local_2188.field_2) {
    operator_delete(local_2188._M_dataplus._M_p,local_2188.field_2._M_allocated_capacity + 1);
  }
  local_2158 = local_20e8.Status;
  uStack_2154 = local_20e8._20_4_;
  local_2168 = (CM_RETURN_STATUS *)local_20e8.Start;
  uStack_2160 = local_20e8.Size;
  local_2098[4] = 0x40;
  local_2098[5] = 0x59;
  __l._M_len = 2;
  __l._M_array = (iterator)(local_2098 + 4);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_21e0,__l,&local_21fa);
  local_2098[2] = 0x39;
  local_2098[3] = 0x20;
  __l_00._M_len = 2;
  __l_00._M_array = (iterator)(local_2098 + 2);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_21f8,__l_00,&local_21f9)
  ;
  In.Size = uStack_2160;
  In.Start = (uint64_t)local_2168;
  In.Status = local_2158;
  In._20_4_ = uStack_2154;
  AssertMatchMulti(In,&local_21e0,&local_21f8,MATCH);
  if (local_21f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_21f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_21f8.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_21f8.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_21e0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_21e0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_21e0.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_21e0.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  ConfusableMatcher::~ConfusableMatcher(&local_2030);
  if (local_21c8 != local_21b8) {
    operator_delete(local_21c8,local_21b8[0] + 1);
  }
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&local_2100);
  return;
}

Assistant:

void Test7()
{
	auto map = GetDefaultMap();

	std::string in = "AAAAAAAAASSAFSAFNFNFNISFNSIFSIFJSDFUDSHF ASUF/|/__/|/___%/|/%I%%/|//|/%%%%%NNNN/|/NN__/|/N__𝘪G___%____$__G__𝓰𝘦Ѓ";

	CMOptions opts = { };
	opts.TimeoutNs = 1000000;
	opts.MatchRepeating = true;
	auto matcher = ConfusableMatcher(map, { "_", "%", "$" });
	auto res = matcher.IndexOf(in, "NIGGER", opts);

	AssertMatchMulti(res, { 64, 89 }, { 57, 32 });
}